

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunctionBody
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function,
          SRCINFO *srcInfo,SerializedFieldList *definedFields)

{
  code *pcVar1;
  Type function_00;
  bool bVar2;
  RegexFlags value;
  uint32 uVar3;
  RegSlot RVar4;
  int iVar5;
  undefined4 *puVar6;
  void *pvVar7;
  PropertyIdArray *propIds;
  RegexPattern *this_00;
  uint index;
  long lVar8;
  int local_50;
  byte local_4c;
  InternalString source;
  
  if ((function->field_0x17d & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x82f,"(!function->GetIsSerialized())",
                                "!function->GetIsSerialized()");
    if (!bVar2) goto LAB_00881a05;
    *puVar6 = 0;
  }
  function->field_0x17d = function->field_0x17d | 8;
  uVar3 = FunctionBody::GetCountField(function,ConstantCount);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x833,"(function->GetConstantCount() != 0)",
                                "function->GetConstantCount() != 0");
    if (!bVar2) {
LAB_00881a05:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  RVar4 = FunctionBody::GetVarCount(function);
  if (RVar4 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 4;
    RVar4 = FunctionBody::GetVarCount(function);
    PrependInt32(this,builder,L"VarCount",RVar4,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ConstantCount);
  if (uVar3 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 8;
    uVar3 = FunctionBody::GetCountField(function,ConstantCount);
    PrependInt32(this,builder,L"ConstantCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFirstTmpRegister(function);
  PrependInt32(this,builder,L"FirstTmpRegister",RVar4,(BufferBuilderInt32 **)0x0);
  RVar4 = FunctionBody::GetOutParamMaxDepth(function);
  if (RVar4 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x10;
    RVar4 = FunctionBody::GetOutParamMaxDepth(function);
    PrependInt32(this,builder,L"OutParamMaxDepth",RVar4,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ByteCodeCount);
  PrependInt32(this,builder,L"ByteCodeCount",uVar3,(BufferBuilderInt32 **)0x0);
  uVar3 = FunctionBody::GetCountField(function,ByteCodeWithoutLDACount);
  PrependInt32(this,builder,L"ByteCodeWithoutLDACount",uVar3,(BufferBuilderInt32 **)0x0);
  uVar3 = FunctionBody::GetCountField(function,ByteCodeInLoopCount);
  if (uVar3 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x20;
    uVar3 = FunctionBody::GetCountField(function,ByteCodeInLoopCount);
    PrependInt32(this,builder,L"ByteCodeInLoopCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  if (function->m_envDepth != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x40;
    PrependInt16(this,builder,L"m_envDepth",function->m_envDepth,(BufferBuilderInt16 **)0x0);
  }
  if (function->m_argUsedForBranch != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x80;
    PrependInt16(this,builder,L"m_argUsedForBranch",function->m_argUsedForBranch,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdLenCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 1;
    PrependInt16(this,builder,L"profiledLdLenCount",function->profiledLdLenCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdElemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 2;
    PrependInt16(this,builder,L"profiledLdElemCount",function->profiledLdElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledStElemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 4;
    PrependInt16(this,builder,L"profiledStElemCount",function->profiledStElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledCallSiteCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 8;
    PrependInt16(this,builder,L"profiledCallSiteCount",function->profiledCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledArrayCallSiteCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x10;
    PrependInt16(this,builder,L"profiledArrayCallSiteCount",function->profiledArrayCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledDivOrRemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x20;
    PrependInt16(this,builder,L"profiledDivOrRemCount",function->profiledDivOrRemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSwitchCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x40;
    PrependInt16(this,builder,L"profiledSwitchCount",function->profiledSwitchCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledReturnTypeCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x80;
    PrependInt16(this,builder,L"profiledReturnTypeCount",function->profiledReturnTypeCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSlotCount != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 1;
    PrependInt16(this,builder,L"profiledSlotCount",function->profiledSlotCount,
                 (BufferBuilderInt16 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,LoopCount);
  if (uVar3 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 2;
    uVar3 = FunctionBody::GetCountField(function,LoopCount);
    PrependInt32(this,builder,L"LoopCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  if (function->m_hasFinally == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 4;
    PrependByte(this,builder,L"m_hasFinally",function->m_hasFinally);
  }
  if (function->hasScopeObject == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 8;
    PrependByte(this,builder,L"hasScopeObject",function->hasScopeObject);
  }
  if (function->hasCachedScopePropIds == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x10;
    PrependByte(this,builder,L"hasCachedScopePropIds",function->hasCachedScopePropIds);
  }
  uVar3 = FunctionBody::GetCountField(function,ForInLoopDepth);
  if (uVar3 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x20;
    uVar3 = FunctionBody::GetCountField(function,ForInLoopDepth);
    PrependInt32(this,builder,L"ForInLoopDepth",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,InlineCacheCount);
  if (uVar3 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x40;
    uVar3 = FunctionBody::GetCountField(function,InlineCacheCount);
    PrependInt32(this,builder,L"InlineCacheCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,RootObjectLoadInlineCacheStart);
  if (uVar3 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x80;
    uVar3 = FunctionBody::GetCountField(function,RootObjectLoadInlineCacheStart);
    PrependInt32(this,builder,L"RootObjectLoadInlineCacheStart",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,RootObjectLoadMethodInlineCacheStart);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 1;
    uVar3 = FunctionBody::GetCountField(function,RootObjectLoadMethodInlineCacheStart);
    PrependInt32(this,builder,L"RootObjectLoadMethodInlineCacheStart",uVar3,
                 (BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,RootObjectStoreInlineCacheStart);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 2;
    uVar3 = FunctionBody::GetCountField(function,RootObjectStoreInlineCacheStart);
    PrependInt32(this,builder,L"RootObjectStoreInlineCacheStart",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,IsInstInlineCacheCount);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 4;
    uVar3 = FunctionBody::GetCountField(function,IsInstInlineCacheCount);
    PrependInt32(this,builder,L"IsInstInlineCacheCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ReferencedPropertyIdCount);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 8;
    uVar3 = FunctionBody::GetCountField(function,ReferencedPropertyIdCount);
    PrependInt32(this,builder,L"ReferencedPropertyIdCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ObjLiteralCount);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x10;
    uVar3 = FunctionBody::GetCountField(function,ObjLiteralCount);
    PrependInt32(this,builder,L"ObjLiteralCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,LiteralRegexCount);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x20;
    uVar3 = FunctionBody::GetCountField(function,LiteralRegexCount);
    PrependInt32(this,builder,L"LiteralRegexCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,InnerScopeCount);
  if (uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x40;
    uVar3 = FunctionBody::GetCountField(function,InnerScopeCount);
    PrependInt32(this,builder,L"InnerScopeCount",uVar3,(BufferBuilderInt32 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ProfiledCallApplyCallSiteCount);
  if ((short)uVar3 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x80;
    uVar3 = FunctionBody::GetCountField(function,ProfiledCallApplyCallSiteCount);
    PrependInt16(this,builder,L"ProfiledCallApplyCallSiteCount",(int16)uVar3,
                 (BufferBuilderInt16 **)0x0);
  }
  uVar3 = FunctionBody::GetCountField(function,ProfiledForInLoopCount);
  if ((short)uVar3 != 0) {
    definedFields->field_0x5 = definedFields->field_0x5 | 1;
    uVar3 = FunctionBody::GetCountField(function,ProfiledForInLoopCount);
    PrependInt16(this,builder,L"ProfiledForInLoopCount",(int16)uVar3,(BufferBuilderInt16 **)0x0);
  }
  RVar4 = FunctionBody::GetLocalClosureRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 2;
    RVar4 = FunctionBody::GetLocalClosureRegister(function);
    PrependInt32(this,builder,L"LocalClosureRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetParamClosureRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 4;
    RVar4 = FunctionBody::GetParamClosureRegister(function);
    PrependInt32(this,builder,L"ParamClosureRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetLocalFrameDisplayRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 8;
    RVar4 = FunctionBody::GetLocalFrameDisplayRegister(function);
    PrependInt32(this,builder,L"LocalFrameDisplayRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetEnvRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x10;
    RVar4 = FunctionBody::GetEnvRegister(function);
    PrependInt32(this,builder,L"EnvRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetThisRegisterForEventHandler(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x20;
    RVar4 = FunctionBody::GetThisRegisterForEventHandler(function);
    PrependInt32(this,builder,L"ThisRegisterForEventHandler",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFirstInnerScopeRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x40;
    RVar4 = FunctionBody::GetFirstInnerScopeRegister(function);
    PrependInt32(this,builder,L"FirstInnerScopeRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFuncExprScopeRegister(function);
  if (RVar4 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x80;
    RVar4 = FunctionBody::GetFuncExprScopeRegister(function);
    PrependInt32(this,builder,L"FuncExprScopeRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  source.m_content.ptr = (char16_t *)function;
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)function,LoopHeaderArray);
  if (pvVar7 != (void *)0x0) {
    definedFields->field_0x6 = definedFields->field_0x6 | 0x10;
    uVar3 = FunctionBody::GetCountField((FunctionBody *)source.m_content.ptr,LoopCount);
    if (uVar3 != 0) {
      lVar8 = 0;
      do {
        PrependInt32(this,builder,L"Loop Header Start",*(int *)((long)pvVar7 + lVar8 + 8),
                     (BufferBuilderInt32 **)0x0);
        PrependInt32(this,builder,L"Loop Header End",*(int *)((long)pvVar7 + lVar8 + 0xc),
                     (BufferBuilderInt32 **)0x0);
        lVar8 = lVar8 + 0x30;
      } while ((ulong)uVar3 * 0x30 != lVar8);
    }
  }
  function_00.ptr = source.m_content.ptr;
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)source.m_content.ptr,AsmJsFunctionInfo);
  if (pvVar7 == (void *)0x0) {
    if ((function_00.ptr[0x23] & L'\x02') != L'\0') {
      definedFields->field_0x6 = definedFields->field_0x6 | 0x20;
      PrependByte(this,builder,L"Asm.js Info Kind",'\x02');
      AddAsmJsModuleInfo(this,builder,(FunctionBody *)function_00.ptr);
    }
  }
  else {
    definedFields->field_0x6 = definedFields->field_0x6 | 0x20;
    PrependByte(this,builder,L"Asm.js Info Kind",'\x01');
    AddAsmJsFunctionInfo(this,builder,(FunctionBody *)function_00.ptr);
  }
  if ((function_00.ptr[0x23] & L'\x04') == L'\0') {
    AddConstantTable(this,builder,(FunctionBody *)function_00.ptr);
    iVar5 = RewriteByteCodesInto
                      (this,builder,L"Rewritten Byte Code",(FunctionBody *)function_00.ptr,
                       *(ByteBlock **)(function_00.ptr + 100),definedFields);
  }
  else {
    AddAsmJsConstantTable(this,builder,(FunctionBody *)function_00.ptr);
    iVar5 = RewriteAsmJsByteCodesInto
                      (this,builder,L"Rewritten Asm.js Byte Code",(FunctionBody *)function_00.ptr,
                       *(ByteBlock **)(function_00.ptr + 100),definedFields);
  }
  if (-1 < iVar5) {
    propIds = FunctionBody::GetFormalsPropIdArray((FunctionBody *)function_00.ptr,false);
    if (propIds != (PropertyIdArray *)0x0) {
      definedFields->field_0x6 = definedFields->field_0x6 | 0x80;
      AddPropertyIdOfFormals(this,builder,propIds,(FunctionBody *)function_00.ptr);
    }
    AddCacheIdToPropertyIdMap(this,builder,(FunctionBody *)function_00.ptr);
    AddReferencedPropertyIdMap(this,builder,(FunctionBody *)function_00.ptr);
    pvVar7 = FunctionProxy::GetAuxPtr
                       ((FunctionProxy *)function_00.ptr,SlotIdInCachedScopeToNestedIndexArray);
    if (pvVar7 == (void *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfeffffffffffffff);
    }
    else {
      *definedFields = (SerializedFieldList)((ulong)*definedFields | 0x100000000000000);
      AddSlotIdInCachedScopeToNestedIndexArray(this,builder,(FunctionBody *)function_00.ptr);
    }
    pvVar7 = FunctionProxy::GetAuxPtr
                       ((FunctionProxy *)function_00.ptr,CallSiteToCallApplyCallSiteArray);
    if (pvVar7 == (void *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfdffffffffffffff);
    }
    else {
      *definedFields = (SerializedFieldList)((ulong)*definedFields | 0x200000000000000);
      AddCallSiteToCallApplyCallSiteArray(this,builder,(FunctionBody *)function_00.ptr);
    }
    uVar3 = GetDebuggerScopeSlotArrayCount(this,(FunctionBody *)function_00.ptr);
    if (uVar3 != 0) {
      definedFields->field_0x7 = definedFields->field_0x7 | 4;
      PrependInt32(this,builder,L"Debugger Scope Slot Array Size",uVar3,(BufferBuilderInt32 **)0x0);
      AddSlotArrayDebuggerScopes(this,builder,(FunctionBody *)function_00.ptr,uVar3);
    }
    uVar3 = FunctionBody::GetCountField((FunctionBody *)function_00.ptr,LiteralRegexCount);
    if (uVar3 != 0) {
      index = 0;
      do {
        this_00 = FunctionBody::GetLiteralRegex((FunctionBody *)function_00.ptr,index);
        if (this_00 == (RegexPattern *)0x0) {
          PrependInt32(this,builder,L"Literal regex source length",-1,(BufferBuilderInt32 **)0x0);
        }
        else {
          UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&local_50);
          PrependInt32(this,builder,L"Literal regex source length",local_50,
                       (BufferBuilderInt32 **)0x0);
          PrependString16(this,builder,L"Literal regex source",
                          (LPCWSTR)((ulong)((uint)local_4c * 2) + source._0_8_),local_50 * 2 + 2);
          value = UnifiedRegex::RegexPattern::GetFlags(this_00);
          PrependByte(this,builder,L"Literal regex flags",value);
        }
        index = index + 1;
        uVar3 = FunctionBody::GetCountField((FunctionBody *)function_00.ptr,LiteralRegexCount);
      } while (index < uVar3);
    }
    PrependSmallSpanSequence
              (this,builder,L"Span Sequence",*(SmallSpanSequence **)(function_00.ptr + 0x90));
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

HRESULT AddFunctionBody(BufferBuilderList &builder, FunctionBody *function, SRCINFO const *srcInfo, SerializedFieldList& definedFields)
    {
        Assert(!function->GetIsSerialized());
        DebugOnly(function->SetIsSerialized(true));

        // This field should always be non-zero
        Assert(function->GetConstantCount() != 0);

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

        {
#define DEFINE_FUNCTION_BODY_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
            if (function->##name != 0) { \
                definedFields.has_##name = true; \
                Prepend##serializableType(builder, _u(#name), function->##name); \
            }

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType) \
            Prepend##serializableType(builder, _u(#name), function->Get##name##());

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD(type, name, serializableType, defaultValue) \
            if (function->Get##name##() != defaultValue) { \
                definedFields.has_##name = true; \
                DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType); \
            }

#include "SerializableFunctionFields.h"
        }

        {
            auto loopHeaderArray = function->GetLoopHeaderArray();
            if (loopHeaderArray != nullptr)
            {
                definedFields.has_loopHeaderArray = true;
                uint loopCount = function->GetLoopCount();
                for (uint i = 0; i < loopCount; ++i)
                {
                    PrependInt32(builder, _u("Loop Header Start"), loopHeaderArray[i].startOffset);
                    PrependInt32(builder, _u("Loop Header End"), loopHeaderArray[i].endOffset);
                }
            }

#ifdef ASMJS_PLAT
            if (function->GetAsmJsFunctionInfo())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 1);
                AddAsmJsFunctionInfo(builder, function);
            }
            else if (function->GetIsAsmjsMode())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 2);
                AddAsmJsModuleInfo(builder, function);
            }
#endif

#ifdef ASMJS_PLAT
            if (function->GetIsAsmJsFunction())
            {
                AddAsmJsConstantTable(builder, function);
                auto hr = RewriteAsmJsByteCodesInto(builder, _u("Rewritten Asm.js Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }
            else
#endif
            {
                AddConstantTable(builder, function);
                auto hr = RewriteByteCodesInto(builder, _u("Rewritten Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }

            PropertyIdArray * propIds = function->GetFormalsPropIdArray(false);
            if (propIds != nullptr)
            {
                definedFields.has_propertyIdOfFormals = true;
                AddPropertyIdOfFormals(builder, propIds, function);
            }

            AddCacheIdToPropertyIdMap(builder, function);
            AddReferencedPropertyIdMap(builder, function);

            if (function->GetSlotIdInCachedScopeToNestedIndexArray() == nullptr)
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = false;
            }
            else
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = true;
                AddSlotIdInCachedScopeToNestedIndexArray(builder, function);
            }

#if ENABLE_NATIVE_CODEGEN
            if (function->GetCallSiteToCallApplyCallSiteArray() == nullptr)
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = false;
            }
            else
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = true;
                AddCallSiteToCallApplyCallSiteArray(builder, function);
            }
#else
            definedFields.has_callSiteToCallApplyCallSiteArray = false;
#endif

            uint debuggerScopeSlotArraySize = GetDebuggerScopeSlotArrayCount(function);
            if (debuggerScopeSlotArraySize != 0)
            {
                definedFields.has_debuggerScopeSlotArray = true;
                PrependInt32(builder, _u("Debugger Scope Slot Array Size"), debuggerScopeSlotArraySize);
                AddSlotArrayDebuggerScopes(builder, function, debuggerScopeSlotArraySize);
            }

            // Literal regexes
            for (uint i = 0; i < function->GetLiteralRegexCount(); ++i)
            {
                const auto literalRegex = function->GetLiteralRegex(i);
                if (!literalRegex)
                {
                    PrependInt32(builder, _u("Literal regex source length"), -1);
                    continue;
                }

                const auto source = literalRegex->GetSource();
                PrependInt32(builder, _u("Literal regex source length"), source.GetLength());
                PrependString16(builder, _u("Literal regex source"), source.GetBuffer(), (source.GetLength() + 1) * sizeof(char16));
                PrependByte(builder, _u("Literal regex flags"), literalRegex->GetFlags());
            }

            // Write the SourceInfo stuff
            PrependSmallSpanSequence(builder, _u("Span Sequence"), function->m_sourceInfo.pSpanSequence);
        }

        return S_OK;
    }